

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

void __thiscall
Catch::JunitReporter::TestCaseStats::TestCaseStats
          (TestCaseStats *this,string *className,string *name)

{
  pointer pcVar1;
  
  (this->m_status)._M_dataplus._M_p = (pointer)&(this->m_status).field_2;
  (this->m_status)._M_string_length = 0;
  (this->m_status).field_2._M_local_buf[0] = '\0';
  (this->m_className)._M_dataplus._M_p = (pointer)&(this->m_className).field_2;
  pcVar1 = (className->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->m_className,pcVar1,pcVar1 + className->_M_string_length);
  (this->m_name)._M_dataplus._M_p = (pointer)&(this->m_name).field_2;
  pcVar1 = (name->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->m_name,pcVar1,pcVar1 + name->_M_string_length);
  (this->m_stdOut)._M_dataplus._M_p = (pointer)&(this->m_stdOut).field_2;
  (this->m_stdOut)._M_string_length = 0;
  (this->m_stdOut).field_2._M_local_buf[0] = '\0';
  (this->m_stdErr)._M_dataplus._M_p = (pointer)&(this->m_stdErr).field_2;
  (this->m_stdErr)._M_string_length = 0;
  (this->m_stdErr).field_2._M_local_buf[0] = '\0';
  (this->m_testStats).
  super__Vector_base<Catch::JunitReporter::TestStats,_std::allocator<Catch::JunitReporter::TestStats>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_testStats).
  super__Vector_base<Catch::JunitReporter::TestStats,_std::allocator<Catch::JunitReporter::TestStats>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_testStats).
  super__Vector_base<Catch::JunitReporter::TestStats,_std::allocator<Catch::JunitReporter::TestStats>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_sections).
  super__Vector_base<Catch::JunitReporter::TestCaseStats,_std::allocator<Catch::JunitReporter::TestCaseStats>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_sections).
  super__Vector_base<Catch::JunitReporter::TestCaseStats,_std::allocator<Catch::JunitReporter::TestCaseStats>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_sections).
  super__Vector_base<Catch::JunitReporter::TestCaseStats,_std::allocator<Catch::JunitReporter::TestCaseStats>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  return;
}

Assistant:

TestCaseStats( const std::string& className, const std::string& name )
            :   m_className( className ),
                m_name( name )
            {}